

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_mtree.c
# Opt level: O1

wchar_t archive_write_set_format_mtree_classic(archive *_a)

{
  long lVar1;
  wchar_t wVar2;
  archive_write *a;
  
  wVar2 = archive_write_set_format_mtree_default(_a,"archive_write_set_format_mtree_classic");
  if (wVar2 == L'\0') {
    lVar1 = _a[1].read_data_offset;
    *(undefined4 *)(lVar1 + 0xd8) = 1;
    *(undefined4 *)(lVar1 + 300) = 1;
  }
  return wVar2;
}

Assistant:

int
archive_write_set_format_mtree_classic(struct archive *_a)
{
	int r;

	r = archive_write_set_format_mtree_default(_a,
		"archive_write_set_format_mtree_classic");
	if (r == ARCHIVE_OK) {
		struct archive_write *a = (struct archive_write *)_a;
		struct mtree_writer *mtree;

		mtree = (struct mtree_writer *)a->format_data;

		/* Set to output a mtree archive in classic format. */
		mtree->classic = 1;
		/* Basically, mtree classic format uses '/set' global
		 * value. */
		mtree->output_global_set = 1;
	}
	return (r);
}